

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_25(QPDF *pdf,char *arg2)

{
  byte bVar1;
  QPDFWriter local_138 [8];
  QPDFWriter w;
  allocator<char> local_121;
  string local_120 [32];
  QPDFObjectHandle local_100;
  QPDFObjectHandle local_f0;
  QPDFObjectHandle local_e0;
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  allocator<char> local_a9;
  string local_a8 [32];
  QPDFObjectHandle local_88;
  allocator<char> local_71;
  string local_70 [32];
  QPDFObjectHandle local_50;
  undefined1 local_40 [8];
  QPDFObjectHandle qtest;
  QPDF local_20 [8];
  QPDF oldpdf;
  char *arg2_local;
  QPDF *pdf_local;
  
  _oldpdf = arg2;
  if (arg2 == (char *)0x0) {
    __assert_fail("arg2 != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x3bc,"void test_25(QPDF &, const char *)");
  }
  QPDF::QPDF(local_20);
  QPDF::processFile((char *)local_20,_oldpdf);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"/QTest",&local_71);
  QPDFObjectHandle::getKey((string *)local_40);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  QPDFObjectHandle::~QPDFObjectHandle(&local_50);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a8,"/QTest",&local_a9);
  QPDFObjectHandle::QPDFObjectHandle(&local_d0,(QPDFObjectHandle *)local_40);
  QPDF::copyForeignObject((QPDFObjectHandle *)&local_c0);
  QPDFObjectHandle::replaceKey((string *)&local_88,(QPDFObjectHandle *)local_a8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  QPDFObjectHandle::~QPDFObjectHandle(&local_88);
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"/Pages",&local_121);
  QPDFObjectHandle::getKey((string *)&local_f0);
  QPDF::copyForeignObject((QPDFObjectHandle *)&local_e0);
  bVar1 = QPDFObjectHandle::isNull();
  if ((bVar1 & 1) == 0) {
    __assert_fail("pdf.copyForeignObject(oldpdf.getRoot().getKey(\"/Pages\")).isNull()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x3c4,"void test_25(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_e0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  QPDFObjectHandle::~QPDFObjectHandle(&local_100);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
  QPDF::~QPDF(local_20);
  QPDFWriter::QPDFWriter(local_138,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_138,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_138);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_138);
  return;
}

Assistant:

static void
test_25(QPDF& pdf, char const* arg2)
{
    // The copy object tests are designed to work with a specific
    // file.  Look at the test suite for the file, and look at the
    // file for comments about the file's structure.

    // Copy qtest without crossing page boundaries.  Should get O1
    // and O2 and their streams but not O3 or any other pages.

    // Also verify that attempts to copy /Pages objects return null.

    assert(arg2 != nullptr);
    {
        // Make sure original PDF is out of scope when we write.
        QPDF oldpdf;
        oldpdf.processFile(arg2);
        QPDFObjectHandle qtest = oldpdf.getTrailer().getKey("/QTest");
        pdf.getTrailer().replaceKey("/QTest", pdf.copyForeignObject(qtest));

        assert(pdf.copyForeignObject(oldpdf.getRoot().getKey("/Pages")).isNull());
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}